

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall
Inferences::InductionClauseIterator::performInfIntInduction
          (InductionClauseIterator *this,InductionContext *context,bool increasing,
          TermLiteralClause *bound)

{
  byte bVar1;
  bool bVar2;
  InductionContext *in_RCX;
  byte in_DL;
  InductionClauseIterator *in_RSI;
  Entry *e;
  InductionContext *in_stack_fffffffffffffee0;
  InductionContext *this_00;
  InductionContext *in_stack_fffffffffffffee8;
  InductionContext *in_stack_fffffffffffffef0;
  Entry **in_stack_ffffffffffffff50;
  Literal *in_stack_ffffffffffffff58;
  Literal *in_stack_ffffffffffffff60;
  InductionContext *in_stack_ffffffffffffff68;
  InductionClauseIterator *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff7f;
  Entry *in_stack_ffffffffffffff80;
  InductionContext *in_stack_ffffffffffffff88;
  InductionClauseIterator *in_stack_ffffffffffffff90;
  TermLiteralClause *in_stack_ffffffffffffffd0;
  TermLiteralClause *bound1;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  bound1 = (TermLiteralClause *)0x0;
  InductionContext::InductionContext(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  bVar2 = notDoneInt(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  InductionContext::~InductionContext(in_stack_fffffffffffffee0);
  if (bVar2) {
    performIntInduction(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f,
                        (TermLiteralClause *)in_stack_ffffffffffffff70,
                        (TermLiteralClause *)in_stack_ffffffffffffff68);
  }
  InductionContext::InductionContext(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  this_00 = in_RCX;
  if ((bVar1 & 1) != 0) {
    this_00 = (InductionContext *)0x0;
  }
  resolveClauses(in_RSI,(InductionContext *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                 (Entry *)in_RCX,bound1,in_stack_ffffffffffffffd0);
  InductionContext::~InductionContext(this_00);
  return;
}

Assistant:

void InductionClauseIterator::performInfIntInduction(const InductionContext& context, bool increasing, const TermLiteralClause& bound)
{
  InductionFormulaIndex::Entry* e = nullptr;
  if (notDoneInt(context, increasing ? bound.literal : nullptr, increasing ? nullptr : bound.literal, e)) {
    performIntInduction(context, e, increasing, bound, nullptr);
  }
  resolveClauses(context, e, increasing ? &bound : nullptr, increasing ? nullptr : &bound);
}